

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::set_outflow_bcs
          (Projection *this,int which_call,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Vel_in,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Divu_in,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Sig_in,int c_lev,int f_lev,
          int have_divu)

{
  int *piVar1;
  IntVect *pIVar2;
  int iVar3;
  pointer pGVar4;
  byte bVar5;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi_00;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar6;
  bool bVar7;
  bool bVar8;
  int dir;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  Box *state_strip_00;
  ulong uVar14;
  Box *pBVar15;
  long lVar16;
  Orientation *outFacesAtThisLevel_00;
  int lev;
  ulong uVar17;
  IntVect IVar18;
  MultiFab *in_stack_fffffffffffff688;
  MultiFab *in_stack_fffffffffffff690;
  int in_stack_fffffffffffff6a0;
  IntVect hi;
  bool hasOutFlow;
  int Divu;
  IndexType IStack_940;
  int iStack_93c;
  int iStack_938;
  int local_934;
  IndexType IStack_930;
  ulong local_928;
  IndexType IStack_920;
  int aiStack_91c [3];
  IndexType IStack_910;
  double local_908;
  Projection *local_900;
  ulong local_8f8;
  int numOutFlowFacesAtAllLevels;
  int Divu_Type;
  uint local_8e0;
  int local_8dc;
  int iStack_8d8;
  int iStack_8d4;
  IndexType IStack_8d0;
  long local_8c8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_8c0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_8b8;
  int local_8b0 [3];
  BoxArray uncovered_outflow_ba;
  Orientation outFaces [6];
  int icount [10];
  int numOutFlowFaces [10];
  Orientation outFacesAtThisLevel [10] [6];
  Box state_strip [10] [6];
  
  local_900 = this;
  if (verbose != 0) {
    poVar9 = amrex::OutStream();
    amrex::Print::Print((Print *)state_strip,poVar9);
    poVar9 = (ostream *)(state_strip[0][0].bigend.vect + 1);
    std::operator<<(poVar9,"...setting outflow bcs for the nodal projection ... ");
    std::operator<<(poVar9,'\n');
    amrex::Print::~Print((Print *)state_strip);
  }
  local_908 = (double)CONCAT44(local_908._4_4_,which_call);
  pBVar15 = (Box *)outFaces;
  outFaces[0].val = -1;
  outFaces[1].val = -1;
  outFaces[2].val = -1;
  outFaces[3].val = -1;
  outFaces[4].val = -1;
  outFaces[5].val = -1;
  memset(outFacesAtThisLevel,0xff,0xf0);
  OutFlowBC::GetOutFlowFaces
            (&hasOutFlow,(Orientation *)pBVar15,local_900->phys_bc,&numOutFlowFacesAtAllLevels);
  lVar12 = 0xc;
  do {
    *(undefined8 *)((long)&outFacesAtThisLevel[9][3].val + lVar12) = 0x100000001;
    *(undefined4 *)((long)&outFacesAtThisLevel[9][5].val + lVar12) = 1;
    *(undefined1 (*) [16])((long)state_strip[0][0].smallend.vect + lVar12) = (undefined1  [16])0x0;
    lVar12 = lVar12 + 0x1c;
  } while (lVar12 != 0x69c);
  for (lVar12 = 0; lVar12 != 10; lVar12 = lVar12 + 1) {
    icount[lVar12] = 0;
  }
  local_8c0 = phi;
  local_8b8 = Sig_in;
  local_928 = 0x100000001;
  IStack_920.itype = 1;
  aiStack_91c[0] = 0;
  aiStack_91c[1] = 0;
  aiStack_91c[2] = 0;
  IStack_910.itype = 0;
  local_8f8 = (long)f_lev;
  local_8c8 = (long)c_lev;
  for (lVar12 = 0; pVVar6 = local_8b8, phi_00 = local_8c0, lVar16 = local_8c8,
      lVar12 < numOutFlowFacesAtAllLevels; lVar12 = lVar12 + 1) {
    uVar11 = (long)outFaces[lVar12].val % 3;
    lVar16 = (long)(int)uVar11;
    bVar5 = (byte)uVar11 & 0x1f;
    uVar13 = -2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5;
    uVar14 = 0xffffffffffffffff;
    for (uVar17 = local_8f8; local_8c8 <= (long)uVar17; uVar17 = uVar17 - 1) {
      pGVar4 = (local_900->parent->super_AmrCore).super_AmrMesh.geom.
               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar15 = (Box *)((long)(pGVar4 + uVar17) + 0xac);
      iStack_8d8 = (int)((ulong)*(undefined8 *)((long)(pGVar4 + uVar17) + 0xb8) >> 0x20);
      _iStack_8d4 = *(undefined8 *)((long)(pGVar4 + uVar17) + 0xc0);
      _Divu_Type = *(ulong *)&pBVar15->smallend;
      local_8e0 = (uint)*(undefined8 *)((long)(pGVar4 + uVar17) + 0xb4);
      local_8dc = (int)((ulong)*(undefined8 *)((long)(pGVar4 + uVar17) + 0xb4) >> 0x20);
      if (outFaces[lVar12].val - 3U < 3) {
        IStack_940.itype = *(uint *)((long)(pGVar4 + uVar17) + 0xb4);
        _Divu = *(ulong *)&pBVar15->smallend;
        hi.vect[2] = *(int *)((long)(pGVar4 + uVar17) + 0xc0);
        hi.vect._0_8_ = *(undefined8 *)((long)(pGVar4 + uVar17) + 0xb8);
        IVar18 = amrex::Box::type((Box *)&Divu_Type);
        local_8b0[0] = IVar18.vect[0];
        local_8b0[1] = IVar18.vect[1];
        local_8b0[2] = IVar18.vect[2];
        iVar3 = hi.vect[lVar16];
        (&Divu)[lVar16] = (~local_8b0[lVar16] & 1U) + iVar3;
        hi.vect[lVar16] = (~local_8b0[lVar16] & 1U) + iVar3 + 1;
        uncovered_outflow_ba.m_bat._0_8_ = _Divu;
        uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_typ.itype =
             (IndexType)(IndexType)IStack_940.itype;
        uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = hi.vect[2];
        uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = hi.vect[0];
        uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = hi.vect[1];
        local_928 = _Divu;
        IStack_920.itype = IStack_940.itype;
        aiStack_91c[0] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
        aiStack_91c[1] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        aiStack_91c[2] = hi.vect[2];
        IStack_910.itype = IStack_8d0.itype & uVar13;
        iVar3 = -2;
      }
      else {
        IStack_940.itype = *(uint *)((long)(pGVar4 + uVar17) + 0xb4);
        _Divu = *(ulong *)&pBVar15->smallend;
        hi.vect[2] = *(int *)((long)(pGVar4 + uVar17) + 0xc0);
        hi.vect._0_8_ = *(undefined8 *)((long)(pGVar4 + uVar17) + 0xb8);
        iVar3 = (&Divu)[lVar16];
        (&Divu)[lVar16] = iVar3 + -2;
        hi.vect[lVar16] = iVar3 + -1;
        uncovered_outflow_ba.m_bat._0_8_ = _Divu;
        uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_typ.itype =
             (IndexType)(IndexType)IStack_940.itype;
        uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = hi.vect[2];
        uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = hi.vect[0];
        uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = hi.vect[1];
        local_928 = _Divu;
        IStack_920.itype = IStack_940.itype;
        aiStack_91c[0] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
        aiStack_91c[1] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        aiStack_91c[2] = hi.vect[2];
        IStack_910.itype = IStack_8d0.itype & uVar13;
        iVar3 = 2;
      }
      piVar1 = (int *)((long)&local_928 + lVar16 * 4);
      local_928 = uncovered_outflow_ba.m_bat._0_8_;
      IStack_920.itype = (uint)uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_typ.itype;
      aiStack_91c[0] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
      aiStack_91c[1] = uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
      aiStack_91c[2] = hi.vect[2];
      uncovered_outflow_ba.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = hi.vect[2];
      *piVar1 = *piVar1 + iVar3;
      aiStack_91c[lVar16] = aiStack_91c[lVar16] + iVar3;
      for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
        if ((uVar11 & 0xffffffff) != uVar10) {
          piVar1 = (int *)((long)&local_928 + uVar10 * 4);
          *piVar1 = *piVar1 + -1;
          aiStack_91c[uVar10] = aiStack_91c[uVar10] + 1;
        }
      }
      uVar10 = CONCAT44(-(uint)((int)(_Divu_Type >> 0x20) < (int)(local_928 >> 0x20)),
                        -(uint)((int)_Divu_Type < (int)local_928));
      _Divu = ~uVar10 & _Divu_Type | local_928 & uVar10;
      IStack_940.itype = local_8e0;
      if ((int)local_8e0 < (int)IStack_920.itype) {
        IStack_940.itype = IStack_920.itype;
      }
      uVar10 = CONCAT44(-(uint)(aiStack_91c[1] < iStack_8d8),-(uint)(aiStack_91c[0] < local_8dc));
      uVar10 = ~uVar10 & CONCAT44(iStack_8d8,local_8dc) |
               CONCAT44(aiStack_91c[1],aiStack_91c[0]) & uVar10;
      iStack_93c = (int)uVar10;
      iStack_938 = (int)(uVar10 >> 0x20);
      local_934 = iStack_8d4;
      if (aiStack_91c[2] < iStack_8d4) {
        local_934 = aiStack_91c[2];
      }
      IStack_930.itype = IStack_910.itype;
      pBVar15 = (Box *)&Divu;
      amrex::complementIn(&uncovered_outflow_ba,pBVar15,
                          (BoxArray *)
                          ((long)(local_900->parent->amr_level).
                                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_t + 0xd8));
      if ((((uncovered_outflow_ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           ((uncovered_outflow_ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start) && ((int)uVar14 == -1)) {
        iVar3 = icount[uVar17];
        outFacesAtThisLevel[uVar17][iVar3].val = outFaces[lVar12].val;
        pIVar2 = &state_strip[uVar17][iVar3].bigend;
        *(ulong *)pIVar2->vect = CONCAT44(aiStack_91c[1],aiStack_91c[0]);
        *(ulong *)(pIVar2->vect + 2) = CONCAT44(IStack_910.itype,aiStack_91c[2]);
        *(ulong *)state_strip[uVar17][iVar3].smallend.vect = local_928;
        *(ulong *)(state_strip[uVar17][iVar3].smallend.vect + 2) =
             CONCAT44(aiStack_91c[0],IStack_920.itype);
        icount[uVar17] = iVar3 + 1;
        uVar14 = uVar17 & 0xffffffff;
      }
      amrex::BoxArray::~BoxArray(&uncovered_outflow_ba);
    }
  }
  uVar13 = local_908._0_4_;
  for (uVar11 = local_8f8; local_8c8 <= (long)uVar11; uVar11 = uVar11 - 1) {
    numOutFlowFaces[uVar11] = icount[uVar11];
  }
  if ((local_908._0_4_ == 0x3ea) || (local_908._0_4_ == 0x3ec)) {
    std::__cxx11::string::string((string *)&uncovered_outflow_ba,"divu",(allocator *)&hi);
    pBVar15 = (Box *)&Divu_Type;
    bVar7 = amrex::AmrLevel::isStateVariable((string *)&uncovered_outflow_ba,(int *)pBVar15,&Divu);
    std::__cxx11::string::~string((string *)&uncovered_outflow_ba);
    if (!bVar7) {
      amrex::Error_host("Projection::set_outflow_bcs: No divu.");
    }
  }
  local_908 = 0.0;
  if ((uVar13 & 0xfffffffd) == 0x3e9) {
    local_908 = NavierStokesBase::gravity;
    std::__cxx11::string::string((string *)&uncovered_outflow_ba,"divu",(allocator *)&hi);
    pBVar15 = (Box *)&Divu_Type;
    bVar8 = amrex::AmrLevel::isStateVariable((string *)&uncovered_outflow_ba,(int *)pBVar15,&Divu);
    bVar7 = local_908 == 0.0;
    std::__cxx11::string::~string((string *)&uncovered_outflow_ba);
    if (bVar7 && !bVar8) {
      amrex::Error_host("Projection::set_outflow_bcs: No divu or gravity.");
    }
  }
  state_strip_00 = state_strip[lVar16];
  outFacesAtThisLevel_00 = outFacesAtThisLevel[lVar16];
  for (; lVar16 <= (long)local_8f8; lVar16 = lVar16 + 1) {
    if (0 < numOutFlowFaces[lVar16]) {
      set_outflow_bcs_at_level
                (local_900,(int)pBVar15,(int)lVar16,c_lev,state_strip_00,outFacesAtThisLevel_00,
                 numOutFlowFaces[lVar16],phi_00,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                 (pVVar6->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16],in_stack_fffffffffffff6a0,local_908);
    }
    state_strip_00 = state_strip_00 + 6;
    outFacesAtThisLevel_00 = outFacesAtThisLevel_00 + 6;
  }
  return;
}

Assistant:

void
Projection::set_outflow_bcs (int        which_call,
                             const Vector<MultiFab*>& phi,
                             const Vector<MultiFab*>& Vel_in,
                             const Vector<MultiFab*>& Divu_in,
                             const Vector<MultiFab*>& Sig_in,
                             int        c_lev,
                             int        f_lev,
                             int        have_divu)
{
    AMREX_ASSERT((which_call == INITIAL_VEL  ) ||
                 (which_call == INITIAL_PRESS) ||
                 (which_call == INITIAL_SYNC ) ||
                 (which_call == LEVEL_PROJ   ) );

    if (which_call != LEVEL_PROJ)
        AMREX_ASSERT(c_lev == 0);

    if (verbose)
      amrex::Print() << "...setting outflow bcs for the nodal projection ... " << '\n';

    bool        hasOutFlow;
    Orientation outFaces[2*AMREX_SPACEDIM];
    Orientation outFacesAtThisLevel[maxlev][2*AMREX_SPACEDIM];

    int fine_level[2*AMREX_SPACEDIM];

    int numOutFlowFacesAtAllLevels;
    int numOutFlowFaces[maxlev];
    OutFlowBC::GetOutFlowFaces(hasOutFlow,outFaces,phys_bc,numOutFlowFacesAtAllLevels);

    //
    // Get 2-wide cc box, state_strip, along interior of top.
    // Get 1-wide nc box, phi_strip  , along top.
    //
    const int ccStripWidth = 2;

//    const int nCompPhi    = 1;
//    const int srcCompVel  = Xvel;
//    const int srcCompDivu = 0;
//    const int   nCompVel  = AMREX_SPACEDIM;
//    const int   nCompDivu = 1;

    //
    // Determine the finest level such that the entire outflow face is covered
    // by boxes at this level (skip if doesnt touch, and bomb if only partially
    // covered).
    //
    Box state_strip[maxlev][2*AMREX_SPACEDIM];

    int icount[maxlev];
    for (int i=0; i < maxlev; i++) icount[i] = 0;

    //
    // This loop is only to define the number of outflow faces at each level.
    //
    Box temp_state_strip;
    for (int iface = 0; iface < numOutFlowFacesAtAllLevels; iface++)
    {
      const int outDir    = outFaces[iface].coordDir();

      fine_level[iface] = -1;
      for (int lev = f_lev; lev >= c_lev; lev--)
      {
        Box domain = parent->Geom(lev).Domain();

        if (outFaces[iface].faceDir() == Orientation::high)
        {
            temp_state_strip = amrex::adjCellHi(domain,outDir,ccStripWidth);
            temp_state_strip.shift(outDir,-ccStripWidth);
        }
        else
        {
            temp_state_strip = amrex::adjCellLo(domain,outDir,ccStripWidth);
            temp_state_strip.shift(outDir,ccStripWidth);
        }
        // Grow the box by one tangentially in order to get velocity bc's.
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
          if (dir != outDir) temp_state_strip.grow(dir,1);

        const BoxArray& Lgrids               = parent->getLevel(lev).boxArray();
        const Box&      valid_state_strip    = temp_state_strip & domain;
        const BoxArray  uncovered_outflow_ba = amrex::complementIn(valid_state_strip,Lgrids);

        AMREX_ASSERT( !(uncovered_outflow_ba.size() &&
                     amrex::intersect(Lgrids,valid_state_strip).size()) );

        if ( !(uncovered_outflow_ba.size()) && fine_level[iface] == -1) {
            int ii = icount[lev];
            outFacesAtThisLevel[lev][ii] = outFaces[iface];
            state_strip[lev][ii] = temp_state_strip;
            fine_level[iface] = lev;
            icount[lev]++;
        }
      }
    }

    for (int lev = f_lev; lev >= c_lev; lev--) {
      numOutFlowFaces[lev] = icount[lev];
    }

    NavierStokesBase* ns0 = dynamic_cast<NavierStokesBase*>(LevelData[c_lev]);
    AMREX_ASSERT(!(ns0 == 0));

    int Divu_Type, Divu;
    Real gravity = 0;

    if (which_call == INITIAL_SYNC || which_call == INITIAL_VEL)
    {
      if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu))
        amrex::Error("Projection::set_outflow_bcs: No divu.");
    }

    if (which_call == INITIAL_PRESS || which_call == LEVEL_PROJ)
    {
      gravity = ns0->getGravity();
      if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu) &&
          (gravity == 0) )
        amrex::Error("Projection::set_outflow_bcs: No divu or gravity.");
    }

    for (int lev = c_lev; lev <= f_lev; lev++)
    {
      if (numOutFlowFaces[lev] > 0)
        set_outflow_bcs_at_level (which_call,lev,c_lev,
                                  state_strip[lev],
                                  outFacesAtThisLevel[lev],
                                  numOutFlowFaces[lev],
                                  phi,
                                  Vel_in[lev],
                                  Divu_in[lev],
                                  Sig_in[lev],
                                  have_divu,
                                  gravity);

    }

}